

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void outputVector<double>(vector<double,_std::allocator<double>_> *vector,string *filename)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_228;
  int i;
  string local_218 [8];
  ofstream stream;
  string *filename_local;
  vector<double,_std::allocator<double>_> *vector_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,(_Ios_Openmode)filename);
  local_228 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(vector);
    if (sVar1 <= (ulong)(long)local_228) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](vector,(long)local_228);
    std::ostream::operator<<((ostream *)local_218,*pvVar2);
    std::ostream::operator<<((ostream *)local_218,std::endl<char,std::char_traits<char>>);
    local_228 = local_228 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void outputVector(const std::vector<T> &vector, std::string filename){
    std::ofstream stream;
    stream.open(filename, std::ios::out);
    for(int i=0;i<vector.size();i++){
        stream<<vector[i];
        stream<<std::endl;
    }
    stream.close();
}